

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O0

void update_coeff_general
               (int *accu_rate,int64_t *accu_dist,int si,int eob,TX_SIZE tx_size,TX_CLASS tx_class,
               int bhl,int width,int64_t rdmult,int shift,int dc_sign_ctx,int16_t *dequant,
               int16_t *scan,LV_MAP_COEFF_COST *txb_costs,tran_low_t *tcoeff,tran_low_t *qcoeff,
               tran_low_t *dqcoeff,uint8_t *levels,qm_val_t *iqmatrix,qm_val_t *qmatrix)

{
  undefined1 uVar1;
  int dqv_00;
  int coeff_idx;
  int bhl_00;
  uint sign_00;
  int abs_qc_00;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int *in_RDI;
  int in_R8D;
  undefined1 in_R9B;
  int in_stack_00000008;
  long in_stack_00000018;
  int in_stack_00000020;
  int16_t *in_stack_00000030;
  long in_stack_00000038;
  long in_stack_00000040;
  long in_stack_00000048;
  int rate_low;
  int64_t rd_low;
  int64_t dist_low;
  long in_stack_00000060;
  tran_low_t abs_qc_low;
  tran_low_t dqc_low;
  tran_low_t qc_low;
  int64_t rd;
  int rate;
  int64_t dist0;
  int64_t dist;
  tran_low_t dqc;
  tran_low_t tqc;
  tran_low_t abs_qc;
  int sign;
  int coeff_ctx;
  int is_last;
  tran_low_t qc;
  int ci;
  int dqv;
  int in_stack_ffffffffffffff3c;
  uint8_t *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int abs_qc_01;
  long *plVar3;
  int local_8c;
  int64_t local_80;
  int local_74;
  tran_low_t local_70;
  tran_low_t local_6c;
  long local_68;
  int local_5c;
  int64_t local_58;
  int64_t local_50;
  tran_low_t local_48;
  tran_low_t local_44;
  TX_SIZE in_stack_ffffffffffffffc0;
  TX_CLASS in_stack_ffffffffffffffc8;
  TX_CLASS tx_class_00;
  undefined2 in_stack_ffffffffffffffdc;
  
  uVar1 = (undefined1)in_R8D;
  abs_qc_01 = in_EDX;
  plVar3 = in_RSI;
  dqv_00 = get_dqv(in_stack_00000030,(int)*(short *)(in_stack_00000038 + (long)in_EDX * 2),_dqc_low)
  ;
  coeff_idx = (int)*(short *)(in_stack_00000038 + (long)in_EDX * 2);
  iVar2 = *(int *)(rd_low + (long)coeff_idx * 4);
  bhl_00 = get_lower_levels_ctx_general
                     (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                      (int)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                      in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffc8);
  if (iVar2 == 0) {
    *in_RDI = *(int *)(in_stack_00000040 + 0x98 + (long)bhl_00 * 0x20) + *in_RDI;
  }
  else {
    sign_00 = (uint)(iVar2 < 0);
    abs_qc_00 = iVar2;
    if (iVar2 < 1) {
      abs_qc_00 = -iVar2;
    }
    local_44 = *(tran_low_t *)(in_stack_00000048 + (long)coeff_idx * 4);
    local_48 = *(tran_low_t *)(dist_low + (long)coeff_idx * 4);
    local_50 = get_coeff_dist(local_44,local_48,in_stack_00000020,(qm_val_t *)rd,coeff_idx);
    tx_class_00 = (TX_CLASS)iVar2;
    local_58 = get_coeff_dist(local_44,0,in_stack_00000020,(qm_val_t *)rd,coeff_idx);
    local_5c = get_coeff_cost_general
                         ((int)((ulong)plVar3 >> 0x20),(int)plVar3,abs_qc_01,in_ECX,in_R8D,
                          in_stack_ffffffffffffff58,(LV_MAP_COEFF_COST *)CONCAT44(sign_00,abs_qc_00)
                          ,bhl_00,tx_class_00,
                          (uint8_t *)
                          CONCAT17(uVar1,CONCAT16(in_R9B,CONCAT24(in_stack_ffffffffffffffdc,dqv_00))
                                  ));
    local_68 = (local_5c * in_stack_00000018 + 0x100 >> 9) + local_50 * 0x80;
    if (abs_qc_00 == 1) {
      local_70 = 0;
      local_6c = 0;
      local_74 = 0;
      local_80 = local_58;
      local_8c = *(int *)(in_stack_00000040 + 0x98 + (long)bhl_00 * 0x20);
    }
    else {
      get_qc_dqc_low(abs_qc_00,sign_00,dqv_00,in_stack_00000020,&local_6c,&local_70);
      local_74 = abs_qc_00 + -1;
      local_80 = get_coeff_dist(local_44,local_70,in_stack_00000020,(qm_val_t *)rd,coeff_idx);
      local_8c = get_coeff_cost_general
                           ((int)((ulong)plVar3 >> 0x20),(int)plVar3,abs_qc_01,in_ECX,in_R8D,
                            in_stack_ffffffffffffff58,
                            (LV_MAP_COEFF_COST *)CONCAT44(sign_00,abs_qc_00),bhl_00,tx_class_00,
                            (uint8_t *)
                            CONCAT17(uVar1,CONCAT16(in_R9B,CONCAT24(in_stack_ffffffffffffffdc,dqv_00
                                                                   ))));
    }
    if ((local_8c * in_stack_00000018 + 0x100 >> 9) + local_80 * 0x80 < local_68) {
      *(tran_low_t *)(rd_low + (long)coeff_idx * 4) = local_6c;
      *(tran_low_t *)(dist_low + (long)coeff_idx * 4) = local_70;
      if (0x7e < local_74) {
        local_74 = 0x7f;
      }
      uVar1 = (undefined1)local_74;
      iVar2 = get_padded_idx(coeff_idx,in_stack_00000008);
      *(undefined1 *)(in_stack_00000060 + iVar2) = uVar1;
      *in_RDI = local_8c + *in_RDI;
      *in_RSI = (local_80 - local_58) + *in_RSI;
    }
    else {
      *in_RDI = local_5c + *in_RDI;
      *in_RSI = (local_50 - local_58) + *in_RSI;
    }
  }
  return;
}

Assistant:

static inline void update_coeff_general(
    int *accu_rate, int64_t *accu_dist, int si, int eob, TX_SIZE tx_size,
    TX_CLASS tx_class, int bhl, int width, int64_t rdmult, int shift,
    int dc_sign_ctx, const int16_t *dequant, const int16_t *scan,
    const LV_MAP_COEFF_COST *txb_costs, const tran_low_t *tcoeff,
    tran_low_t *qcoeff, tran_low_t *dqcoeff, uint8_t *levels,
    const qm_val_t *iqmatrix, const qm_val_t *qmatrix) {
  const int dqv = get_dqv(dequant, scan[si], iqmatrix);
  const int ci = scan[si];
  const tran_low_t qc = qcoeff[ci];
  const int is_last = si == (eob - 1);
  const int coeff_ctx = get_lower_levels_ctx_general(
      is_last, si, bhl, width, levels, ci, tx_size, tx_class);
  if (qc == 0) {
    *accu_rate += txb_costs->base_cost[coeff_ctx][0];
  } else {
    const int sign = (qc < 0) ? 1 : 0;
    const tran_low_t abs_qc = abs(qc);
    const tran_low_t tqc = tcoeff[ci];
    const tran_low_t dqc = dqcoeff[ci];
    const int64_t dist = get_coeff_dist(tqc, dqc, shift, qmatrix, ci);
    const int64_t dist0 = get_coeff_dist(tqc, 0, shift, qmatrix, ci);
    const int rate =
        get_coeff_cost_general(is_last, ci, abs_qc, sign, coeff_ctx,
                               dc_sign_ctx, txb_costs, bhl, tx_class, levels);
    const int64_t rd = RDCOST(rdmult, rate, dist);

    tran_low_t qc_low, dqc_low;
    tran_low_t abs_qc_low;
    int64_t dist_low, rd_low;
    int rate_low;
    if (abs_qc == 1) {
      abs_qc_low = qc_low = dqc_low = 0;
      dist_low = dist0;
      rate_low = txb_costs->base_cost[coeff_ctx][0];
    } else {
      get_qc_dqc_low(abs_qc, sign, dqv, shift, &qc_low, &dqc_low);
      abs_qc_low = abs_qc - 1;
      dist_low = get_coeff_dist(tqc, dqc_low, shift, qmatrix, ci);
      rate_low =
          get_coeff_cost_general(is_last, ci, abs_qc_low, sign, coeff_ctx,
                                 dc_sign_ctx, txb_costs, bhl, tx_class, levels);
    }

    rd_low = RDCOST(rdmult, rate_low, dist_low);
    if (rd_low < rd) {
      qcoeff[ci] = qc_low;
      dqcoeff[ci] = dqc_low;
      levels[get_padded_idx(ci, bhl)] = AOMMIN(abs_qc_low, INT8_MAX);
      *accu_rate += rate_low;
      *accu_dist += dist_low - dist0;
    } else {
      *accu_rate += rate;
      *accu_dist += dist - dist0;
    }
  }
}